

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ll.c
# Opt level: O2

int ll_insert_after(ll_head *q_head,ll_elem *n,ll_elem *rel,int wait)

{
  atomic_size_t *paVar1;
  int iVar2;
  ll_elem *plVar3;
  size_t count;
  size_t count_00;
  size_t count_01;
  size_t count_02;
  ll_head *q_head_00;
  
  if (((ulong)q_head & 3) != 0) {
    __assert_fail("q == ptr_clear(q)",
                  "/workspace/llm4binary/github/license_c_cmakelists/nahratzah[P]ll/src/ll.c",0x406,
                  "int ll_insert_after(struct ll_head *, struct ll_elem *, struct ll_elem *, int)");
  }
  if ((ll_elem *)((ulong)n & 0xfffffffffffffffc) == n) {
    if ((ll_elem *)((ulong)rel & 0xfffffffffffffffc) != rel) {
      __assert_fail("rel == ptr_clear(rel)",
                    "/workspace/llm4binary/github/license_c_cmakelists/nahratzah[P]ll/src/ll.c",
                    0x408,
                    "int ll_insert_after(struct ll_head *, struct ll_elem *, struct ll_elem *, int)"
                   );
    }
    if (wait == 0) {
      iVar2 = insert_lock(n);
      if (iVar2 == 0) {
        return 0;
      }
    }
    else {
      unlink_release((ll_head *)n,(ll_elem *)0x1,(int)rel);
    }
    LOCK();
    paVar1 = &((ll_elem *)((ulong)n & 0xfffffffffffffffc))->refcnt;
    *paVar1 = *paVar1 + 1;
    UNLOCK();
    LOCK();
    paVar1 = &((ll_elem *)((ulong)rel & 0xfffffffffffffffc))->refcnt;
    *paVar1 = *paVar1 + 1;
    UNLOCK();
    do {
      do {
        plVar3 = succ(q_head,rel);
        q_head_00 = (ll_head *)((ulong)plVar3 & 0xfffffffffffffffc);
        iVar2 = insert_between(q_head,n,rel,(ll_elem *)q_head_00);
        if (iVar2 != 0) {
          deref_release((ll_head *)rel,(ll_elem *)0x1,count);
          deref_release(q_head_00,(ll_elem *)0x1,count_01);
          deref_release((ll_head *)n,(ll_elem *)0x1,count_02);
          return 1;
        }
        deref_release(q_head_00,(ll_elem *)0x1,count);
      } while ((*(ulong *)(((ulong)rel & 0xfffffffffffffffc) + 8) & 2) == 0);
      plVar3 = pred(q_head,rel);
      deref_release((ll_head *)rel,(ll_elem *)0x1,count_00);
      rel = (ll_elem *)((ulong)plVar3 & 0xfffffffffffffffc);
    } while( true );
  }
  __assert_fail("n == ptr_clear(n)",
                "/workspace/llm4binary/github/license_c_cmakelists/nahratzah[P]ll/src/ll.c",0x407,
                "int ll_insert_after(struct ll_head *, struct ll_elem *, struct ll_elem *, int)");
}

Assistant:

int
ll_insert_after(struct ll_head *q_head, struct ll_elem *n,
    struct ll_elem *rel, int wait)
{
	struct ll_elem	*q, *s, *p, *p_;

	q = &q_head->q;
	assert(q == ptr_clear(q));
	assert(n == ptr_clear(n));
	assert(rel == ptr_clear(rel));

	/*
	 * Mark n for insert.  If this fails, n is either on a queue or
	 * being inserted/deleted.
	 *
	 * Required that n is properly initialized.
	 */
	if (wait)
		unlink_release(q_head, n, 1);
	else if (!insert_lock(n))
		return 0;
	deref_acquire(n, 1);

	/* This is insert_after, so rel is the predecessor. */
	s = NULL;
	p = rel;
	deref_acquire(p, 1);	/* Our local reference. */

	/* Lookup successor. */
	s = ptr_clear(succ(q_head, p));

	/*
	 * We now have:
	 * - p -- the predecessor of the insert position
	 * - s -- the successor of the insert position
	 * - n -- the node we need to insert between p and s
	 *
	 * Note that both p and s may be deleted by the time we read this
	 * comment.
	 */
	while (!insert_between(q_head, n, p, s)) {
		/*
		 * Insert failed.
		 * This means at least one of p and s is no longer suitable.
		 * Forget s, fix p and re-resolve s.
		 */

		/* Forget s. */
		deref_release(q_head, s, 1);

		/* Fix p:
		 * if it is deleted, we need to insert after its predecessor.
		 */
		if (deleted(p)) {
			p_ = p;
			p = ptr_clear(pred(q_head, p));
			deref_release(q_head, p_, 1);
		}

		/* Find correct s. */
		s = ptr_clear(succ(q_head, p));
	}

	/*
	 * We have succesfully inserted n.
	 * Release our references on n, p and s.
	 */
	deref_release(q_head, p, 1);
	deref_release(q_head, s, 1);
	deref_release(q_head, n, 1);
	return 1;
}